

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_next_call_previous_controls_are_cleared_out_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_after_next_call_previous_controls_are_cleared_out_Test
           *this)

{
  bool bVar1;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  *pmVar2;
  char *pcVar3;
  char *in_R9;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_2c0;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_220;
  Message local_218;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_210;
  size_type local_1a0;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  Subject local_168 [24];
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_150;
  Subject local_e0 [40];
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_next_subscription_sync_after_next_call_previous_controls_are_cleared_out_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::subject::Subject::Subject(local_e0,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_e0,0);
  subject::Subject::~Subject(local_e0);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->(&local_150);
  bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_150);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_168,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_168,1);
  subject::Subject::~Subject(local_168);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&gtest_ar.message_,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,&gtest_ar.message_,0);
  subject::Subject::~Subject((Subject *)&gtest_ar.message_);
  local_194 = 2;
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->(&local_210);
  pmVar2 = (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  local_1a0 = std::
              map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
              ::size(pmVar2);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_190,"2",
             "subject_register.NextSubscriptionSync()->GetControls().size()",&local_194,&local_1a0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x330,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&gtest_ar_.message_,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,&gtest_ar_.message_,0);
  subject::Subject::~Subject((Subject *)&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->(&local_2c0);
  pmVar2 = (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  local_249 = std::
              map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
              ::empty(pmVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_2c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)local_248,
               (AssertionResult *)"subject_register.NextSubscriptionSync()->GetControls().empty()",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x333,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_next_call_previous_controls_are_cleared_out)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFS_SUBJECT1, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.NextSubscriptionSync()->GetSubjects();

    subject_register.Unregister(SS_RFS_SUBJECT1);
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFS_SUBJECT1, true);
    subject_register.Register(SS_RFQ_SUBJECT3, false);

    EXPECT_EQ(2, subject_register.NextSubscriptionSync()->GetControls().size());

    subject_register.Register(SS_SUBJECT0, false);
    EXPECT_TRUE(subject_register.NextSubscriptionSync()->GetControls().empty());
}